

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

uint threadProc(void *param)

{
  __pid_t _Var1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  _Var1 = Signal::wait((Signal *)param,(void *)0x3e8);
  if ((char)_Var1 == '\0') {
    uVar4 = 1;
    uVar3 = 0;
    do {
      pcVar2 = "\n";
      if ((int)(uVar4 / 3) * 3 - 1U != uVar3) {
        pcVar2 = " ";
      }
      if ((uVar3 / 5) * 5 == uVar3) {
        Console::errorf("%d%s");
      }
      else {
        Console::printf("%d%s",(ulong)uVar3,pcVar2);
      }
      _Var1 = Signal::wait((Signal *)param,(void *)0x3e8);
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar3 = uVar3 + 1;
    } while ((char)_Var1 == '\0');
  }
  return 0;
}

Assistant:

uint threadProc(void* param)
{
  Signal* termSignal = (Signal*)param;
  int counter = 0;
  while(!termSignal->wait(1000))
  {
    if(counter % 5 == 0)
      Console::errorf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    else
      Console::printf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    ++counter;
  }
  return 0;
}